

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msatSolverSearch.c
# Opt level: O2

void Msat_SolverRemoveLearned(Msat_Solver_t *p)

{
  uint uVar1;
  int iVar2;
  Msat_Clause_t **ppMVar3;
  ulong uVar4;
  ulong uVar5;
  long lVar6;
  
  uVar1 = Msat_ClauseVecReadSize(p->vLearned);
  ppMVar3 = Msat_ClauseVecReadArray(p->vLearned);
  uVar4 = 0;
  uVar5 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar5 = uVar4;
  }
  while( true ) {
    if (uVar5 == uVar4) {
      Msat_ClauseVecShrink(p->vLearned,0);
      iVar2 = Msat_ClauseVecReadSize(p->vClauses);
      p->nClauses = iVar2;
      iVar2 = p->nVarsAlloc;
      for (lVar6 = 0; lVar6 < iVar2; lVar6 = lVar6 + 1) {
        p->pReasons[lVar6] = (Msat_Clause_t *)0x0;
      }
      return;
    }
    iVar2 = Msat_ClauseIsLocked(p,ppMVar3[uVar4]);
    if (iVar2 != 0) break;
    Msat_ClauseFree(p,ppMVar3[uVar4],1);
    uVar4 = uVar4 + 1;
  }
  __assert_fail("!Msat_ClauseIsLocked( p, pLearned[i])",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/msat/msatSolverSearch.c"
                ,0x17d,"void Msat_SolverRemoveLearned(Msat_Solver_t *)");
}

Assistant:

void Msat_SolverRemoveLearned( Msat_Solver_t * p )
{
    Msat_Clause_t ** pLearned;
    int nLearned, i;

    // discard the learned clauses
    nLearned = Msat_ClauseVecReadSize( p->vLearned );
    pLearned = Msat_ClauseVecReadArray( p->vLearned );
    for ( i = 0; i < nLearned; i++ )
    {
        assert( !Msat_ClauseIsLocked( p, pLearned[i]) );
        
        Msat_ClauseFree( p, pLearned[i], 1 );
    }
    Msat_ClauseVecShrink( p->vLearned, 0 );
    p->nClauses = Msat_ClauseVecReadSize(p->vClauses);

    for ( i = 0; i < p->nVarsAlloc; i++ )
        p->pReasons[i] = NULL;
}